

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_IterMultiWithDelete::_Run(_Test_IterMultiWithDelete *this)

{
  DBTest *this_00;
  int iVar1;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 local_249;
  DBTest *local_248;
  Status local_240;
  string local_238;
  string local_218;
  Status local_1f8 [2];
  uint local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  char *local_1d8;
  char *pcStack_1d0;
  int local_1c8;
  stringstream local_1c0 [400];
  Iterator *iter;
  
  local_248 = &this->super_DBTest;
  while( true ) {
    paVar3 = &local_218.field_2;
    paVar2 = &local_238.field_2;
    local_1d8 = (char *)CONCAT71(local_1d8._1_7_,true);
    pcStack_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c8 = 0x3b5;
    std::__cxx11::stringstream::stringstream(local_1c0);
    local_238._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"a","");
    local_218._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"va","");
    local_249 = 0;
    local_1f8[0].state_ = local_238._M_dataplus._M_p;
    local_1e8 = (uint)local_218._M_dataplus._M_p;
    uStack_1e4 = local_218._M_dataplus._M_p._4_4_;
    uStack_1e0 = (undefined4)local_218._M_string_length;
    uStack_1dc = local_218._M_string_length._4_4_;
    (*local_248->db_->_vptr_DB[2])(&local_240,local_248->db_,&local_249,local_1f8,&local_1e8);
    test::Tester::IsOk((Tester *)&local_1d8,&local_240);
    if (local_240.state_ != (char *)0x0) {
      operator_delete__(local_240.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d8);
    local_1d8 = (char *)CONCAT71(local_1d8._1_7_,true);
    pcStack_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c8 = 0x3b6;
    std::__cxx11::stringstream::stringstream(local_1c0);
    local_238._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"b","");
    local_218._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"vb","");
    local_249 = 0;
    local_1f8[0].state_ = local_238._M_dataplus._M_p;
    local_1e8 = (uint)local_218._M_dataplus._M_p;
    uStack_1e4 = local_218._M_dataplus._M_p._4_4_;
    uStack_1e0 = (undefined4)local_218._M_string_length;
    uStack_1dc = local_218._M_string_length._4_4_;
    (*local_248->db_->_vptr_DB[2])(&local_240,local_248->db_,&local_249,local_1f8,&local_1e8);
    test::Tester::IsOk((Tester *)&local_1d8,&local_240);
    if (local_240.state_ != (char *)0x0) {
      operator_delete__(local_240.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d8);
    local_1d8 = (char *)CONCAT71(local_1d8._1_7_,true);
    pcStack_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c8 = 0x3b7;
    std::__cxx11::stringstream::stringstream(local_1c0);
    local_238._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"c","");
    local_218._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"vc","");
    local_249 = 0;
    local_1f8[0].state_ = local_238._M_dataplus._M_p;
    local_1e8 = (uint)local_218._M_dataplus._M_p;
    uStack_1e4 = local_218._M_dataplus._M_p._4_4_;
    uStack_1e0 = (undefined4)local_218._M_string_length;
    uStack_1dc = local_218._M_string_length._4_4_;
    (*local_248->db_->_vptr_DB[2])(&local_240,local_248->db_,&local_249,local_1f8,&local_1e8);
    test::Tester::IsOk((Tester *)&local_1d8,&local_240);
    if (local_240.state_ != (char *)0x0) {
      operator_delete__(local_240.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d8);
    local_1d8 = (char *)CONCAT71(local_1d8._1_7_,true);
    pcStack_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c8 = 0x3b8;
    std::__cxx11::stringstream::stringstream(local_1c0);
    local_238._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"b","");
    local_1e8 = local_1e8 & 0xffffff00;
    local_218._M_dataplus._M_p = local_238._M_dataplus._M_p;
    local_218._M_string_length._0_4_ = (undefined4)local_238._M_string_length;
    local_218._M_string_length._4_4_ = local_238._M_string_length._4_4_;
    (*local_248->db_->_vptr_DB[3])(local_1f8,local_248->db_,&local_1e8);
    test::Tester::IsOk((Tester *)&local_1d8,local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8[0].state_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_1f8[0].state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d8);
    local_1d8 = (char *)CONCAT71(local_1d8._1_7_,true);
    pcStack_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c8 = 0x3b9;
    std::__cxx11::stringstream::stringstream(local_1c0);
    local_218._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"b","");
    DBTest::Get(&local_238,local_248,&local_218,(Snapshot *)0x0);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)&local_1d8,(char (*) [10])"NOT_FOUND",&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d8);
    this_00 = local_248;
    local_1d8 = (char *)0x100;
    pcStack_1d0 = (char *)0x0;
    iVar1 = (*local_248->db_->_vptr_DB[6])(local_248->db_,(Tester *)&local_1d8);
    iter = (Iterator *)CONCAT44(extraout_var,iVar1);
    local_1d8 = "c";
    pcStack_1d0 = (char *)0x1;
    (*iter->_vptr_Iterator[5])(iter,(Tester *)&local_1d8);
    local_1d8 = (char *)CONCAT71(local_1d8._1_7_,true);
    pcStack_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c8 = 0x3bd;
    std::__cxx11::stringstream::stringstream(local_1c0);
    DBTest::IterStatus_abi_cxx11_(&local_238,this_00,iter);
    test::Tester::IsEq<std::__cxx11::string,char[6]>
              ((Tester *)&local_1d8,&local_238,(char (*) [6])"c->vc");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d8);
    (*iter->_vptr_Iterator[7])(iter);
    local_1d8 = (char *)CONCAT71(local_1d8._1_7_,true);
    pcStack_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c8 = 0x3bf;
    std::__cxx11::stringstream::stringstream(local_1c0);
    DBTest::IterStatus_abi_cxx11_(&local_238,local_248,iter);
    test::Tester::IsEq<std::__cxx11::string,char[6]>
              ((Tester *)&local_1d8,&local_238,(char (*) [6])"a->va");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d8);
    (*iter->_vptr_Iterator[1])(iter);
    iVar1 = local_248->option_config_;
    local_248->option_config_ = iVar1 + 1;
    if (2 < iVar1) break;
    DBTest::DestroyAndReopen(local_248,(Options *)0x0);
  }
  return;
}

Assistant:

TEST(DBTest, IterMultiWithDelete) {
  do {
    ASSERT_OK(Put("a", "va"));
    ASSERT_OK(Put("b", "vb"));
    ASSERT_OK(Put("c", "vc"));
    ASSERT_OK(Delete("b"));
    ASSERT_EQ("NOT_FOUND", Get("b"));

    Iterator* iter = db_->NewIterator(ReadOptions());
    iter->Seek("c");
    ASSERT_EQ(IterStatus(iter), "c->vc");
    iter->Prev();
    ASSERT_EQ(IterStatus(iter), "a->va");
    delete iter;
  } while (ChangeOptions());
}